

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::reserve
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,size_t n)

{
  int i;
  uchar *puVar1;
  ulong uVar2;
  
  if (this->nAlloc < n) {
    puVar1 = pmr::polymorphic_allocator<unsigned_char>::allocate_object<unsigned_char>
                       (&this->alloc,n);
    for (uVar2 = 0; uVar2 < this->nStored; uVar2 = uVar2 + 1) {
      puVar1[uVar2] = this->ptr[uVar2];
    }
    pmr::polymorphic_allocator<unsigned_char>::deallocate_object<unsigned_char>
              (&this->alloc,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = puVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }